

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::createMessageFromCommand(helics *this,ActionMessage *cmd)

{
  baseType *pbVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  std::make_unique<helics::Message>();
  __str = (cmd->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0x20;
  lVar3 = 0x70;
  lVar4 = lVar3;
  lVar5 = 0x90;
  lVar2 = lVar6;
  switch((long)(cmd->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__str >> 5) {
  case 1:
switchD_0027a904_caseD_1:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (lVar3 + *(long *)this),__str);
  case 0:
    SmallBuffer::operator=((SmallBuffer *)(*(long *)this + 0x10),&cmd->payload);
    pbVar1 = *(baseType **)this;
    *pbVar1 = (cmd->actionTime).internalTimeCode;
    *(uint16_t *)(pbVar1 + 1) = cmd->flags;
    *(int32_t *)((long)pbVar1 + 0xc) = cmd->messageID;
    return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
           (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
  case 2:
    goto switchD_0027a904_caseD_2;
  case 3:
    lVar5 = 0xb0;
    lVar2 = 0x40;
    lVar4 = 0x90;
    break;
  default:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)this + 0x70),__str);
    __str = (cmd->stringData).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
    lVar5 = 0xd0;
    lVar2 = 0x60;
    lVar6 = 0x40;
    lVar3 = 0x90;
    lVar4 = 0xb0;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (lVar3 + *(long *)this),__str);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&(((cmd->stringData).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6);
switchD_0027a904_caseD_2:
  lVar3 = lVar5;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (lVar4 + *(long *)this),__str);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&(((cmd->stringData).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2);
  goto switchD_0027a904_caseD_1;
}

Assistant:

std::unique_ptr<Message> createMessageFromCommand(ActionMessage&& cmd)
{
    auto msg = std::make_unique<Message>();
    switch (cmd.stringData.size()) {
        case 0:
            break;
        case 1:
            msg->dest = std::move(cmd.stringData[0]);
            break;
        case 2:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            break;
        case 3:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            msg->original_source = std::move(cmd.stringData[2]);
            break;
        default:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            msg->original_source = std::move(cmd.stringData[2]);
            msg->original_dest = std::move(cmd.stringData[3]);
            break;
    }
    msg->data = std::move(cmd.payload);
    msg->time = cmd.actionTime;
    msg->flags = cmd.flags;
    msg->messageID = cmd.messageID;
    return msg;
}